

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

void __thiscall
vera::dynamicCubemap
          (vera *this,
          function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
          *_renderFnc,vec3 _pos,int _viewSize)

{
  undefined8 uVar1;
  undefined4 in_register_00000014;
  int _width;
  int _faceId;
  vec4 vp;
  GLint viewport [4];
  Camera cubemapCam;
  int local_2dc;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_2d8;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_2d4;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_2d0;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  vec3 local_2b0;
  vec3 local_2a0;
  Camera local_290;
  
  local_2a0.field_2 = _pos.field_2;
  local_2a0._0_8_ = _pos._0_8_;
  glGetIntegerv(0xba2,&local_2c8,CONCAT44(in_register_00000014,_viewSize));
  Camera::Camera(&local_290);
  Node::setPosition(&local_290.super_Node,&local_2a0);
  Camera::setFOV(&local_290,90.0);
  _width = (int)_renderFnc;
  Camera::setViewport(&local_290,_width,_width);
  _faceId = 0;
  while (local_2dc = _faceId, _faceId < 6) {
    _local_2d8 = getFaceViewport(_width,_faceId);
    uVar1 = *(undefined8 *)((long)&cubemapDir + (long)_faceId * 0xc);
    local_2b0.field_2.z = (float)(&DAT_00435d58)[(long)_faceId * 3] * -10.0;
    local_2b0.field_1.y = (float)((ulong)uVar1 >> 0x20) * -10.0;
    local_2b0.field_0.x = (float)uVar1 * -10.0;
    Node::lookAt(&local_290.super_Node,&local_2b0,(vec3)ZEXT812(0x3f80000000000000));
    glViewport((int)local_2d8.x,(int)aStack_2d4.y,(int)aStack_2d0.z,(int)aStack_2cc.w);
    glEnable(0xc11);
    glScissor((int)local_2d8.x,(int)aStack_2d4.y,(int)aStack_2d0.z,(int)aStack_2cc.w);
    std::function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>::operator()
              ((function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)> *)
               this,&local_290,(vec<4,_float,_(glm::qualifier)0> *)&local_2d8,&local_2dc);
    _faceId = local_2dc + 1;
  }
  glViewport(local_2c8,local_2c4,local_2c0,local_2bc);
  glDisable(0xc11);
  glScissor(local_2c8,local_2c4,local_2c0,local_2bc);
  Camera::~Camera(&local_290);
  return;
}

Assistant:

void dynamicCubemap(std::function<void(Camera&, glm::vec4&, int&)> _renderFnc, glm::vec3 _pos, int _viewSize) {

    // save the viewport for the total quilt
    GLint viewport[4];
    glGetIntegerv(GL_VIEWPORT, viewport);

    Camera  cubemapCam;
    cubemapCam.setPosition(_pos);
    cubemapCam.setFOV(90.0);
    cubemapCam.setViewport(_viewSize, _viewSize);

    // render views and copy each view to the quilt
    for (int _side = 0; _side < 6; _side++) {
        glm::vec4 vp = getFaceViewport(_viewSize, _side);
        cubemapCam.lookAt( CubemapFace<float>::getFaceDirection(_side) * -10.0f );

        glViewport(vp.x, vp.y, vp.z, vp.w);

        glEnable(GL_SCISSOR_TEST);
        glScissor(vp.x, vp.y, vp.z, vp.w);

        _renderFnc(cubemapCam, vp, _side);
    }

    // reset viewport
    glViewport(viewport[0], viewport[1], viewport[2], viewport[3]);

    // // restore scissor
    glDisable(GL_SCISSOR_TEST);
    glScissor(viewport[0], viewport[1], viewport[2], viewport[3]);


}